

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

int __thiscall DataContainer::GetTypeFromFile(DataContainer *this,ITypeManager *manager)

{
  FILE *pFVar1;
  char *__filename;
  string local_60 [32];
  void *local_40;
  uchar *header;
  long size;
  FILE *pFStack_28;
  int ret;
  FILE *f;
  ITypeManager *manager_local;
  DataContainer *this_local;
  
  f = (FILE *)manager;
  manager_local = (ITypeManager *)this;
  size._4_4_ = GetTypeFromZippedFile(this,manager);
  this_local._4_4_ = size._4_4_;
  if (size._4_4_ == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    pFStack_28 = fopen(__filename,"rb");
    if (pFStack_28 != (FILE *)0x0) {
      fseek(pFStack_28,0,2);
      header = (uchar *)ftell(pFStack_28);
      rewind(pFStack_28);
      local_40 = operator_new__((ulong)header);
      fread(local_40,(size_t)header,1,pFStack_28);
      fclose(pFStack_28);
      size._4_4_ = (**(code **)(*(long *)f + 8))(f,local_40,(ulong)header & 0xffffffff);
      pFVar1 = f;
      if (size._4_4_ == 0) {
        std::__cxx11::string::string(local_60,(string *)&this->current_path_);
        size._4_4_ = (*(code *)**(undefined8 **)pFVar1)(pFVar1,local_60);
        std::__cxx11::string::~string(local_60);
      }
      if (local_40 != (void *)0x0) {
        operator_delete__(local_40);
      }
    }
    this_local._4_4_ = size._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int DataContainer::GetTypeFromFile(ITypeManager* manager)
{
   FILE* f;
   int ret = GetTypeFromZippedFile(manager);
   if (ret != 0)
   {
      return ret;
   }
   if (fopen_s(&f, current_path_.c_str(), "rb") == 0)
   {
      fseek(f, 0, SEEK_END);
      const long size = ftell(f);
      rewind(f);

      auto* header = new unsigned char[size];

      fread(header, size, 1, f);
      fclose(f);

      // Anything from the buffer ?
      ret = manager->GetTypeFromBuffer(header, size);

      // No, check with name
      if (ret == 0)
      {
         ret = manager->GetTypeFromFile(current_path_);
      }

      delete []header;
   }
   return ret;
}